

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreePrevious(BtCursor *pCur)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  byte *in_RDI;
  int idx;
  MemPage *pPage;
  int rc;
  BtCursor *in_stack_ffffffffffffffc8;
  BtCursor *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int local_14;
  int local_4;
  
  if (*in_RDI != 0) {
    if (*in_RDI < 3) {
      iVar2 = 0;
    }
    else {
      iVar2 = btreeRestoreCursorPosition(in_stack_ffffffffffffffd0);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    if (*in_RDI == 1) {
      return 0x65;
    }
    if ((*in_RDI == 2) && (*in_RDI = 0, *(int *)(in_RDI + 4) < 0)) {
      return 0;
    }
    in_stack_ffffffffffffffd8 = 0;
  }
  pcVar1 = *(char **)(in_RDI + 0x88);
  iVar2 = sqlite3FaultSim((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (iVar2 != 0) {
    *pcVar1 = '\0';
  }
  if (*pcVar1 == '\0') {
    local_4 = sqlite3CorruptError(0);
  }
  else {
    if (pcVar1[8] == '\0') {
      uVar3 = (uint)*(ushort *)(in_RDI + 0x56);
      sqlite3Get4byte((u8 *)(*(long *)(pcVar1 + 0x50) +
                            (long)(int)(uint)(*(ushort *)(pcVar1 + 0x1a) &
                                             CONCAT11(*(undefined1 *)
                                                       (*(long *)(pcVar1 + 0x60) +
                                                       (long)(int)(uVar3 << 1)),
                                                      *(undefined1 *)
                                                       (*(long *)(pcVar1 + 0x60) + 1 +
                                                       (long)(int)(uVar3 << 1))))));
      iVar2 = moveToChild(in_stack_ffffffffffffffc8,0);
      if (iVar2 != 0) {
        return iVar2;
      }
      local_14 = moveToRightmost((BtCursor *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
    }
    else {
      while (*(short *)(in_RDI + 0x56) == 0) {
        if (in_RDI[0x54] == 0) {
          *in_RDI = 1;
          return 0x65;
        }
        moveToParent(in_stack_ffffffffffffffd0);
      }
      *(short *)(in_RDI + 0x56) = *(short *)(in_RDI + 0x56) + -1;
      if ((*(char *)(*(long *)(in_RDI + 0x88) + 1) == '\0') ||
         (*(char *)(*(long *)(in_RDI + 0x88) + 8) != '\0')) {
        local_14 = 0;
      }
      else {
        local_14 = sqlite3BtreePrevious(in_stack_ffffffffffffffc8,0);
      }
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

static SQLITE_NOINLINE int btreePrevious(BtCursor *pCur){
  int rc;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & (BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey))==0 );
  assert( pCur->info.nSize==0 );
  if( pCur->eState!=CURSOR_VALID ){
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( CURSOR_SKIPNEXT==pCur->eState ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext<0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  if( sqlite3FaultSim(412) ) pPage->isInit = 0;
  if( !pPage->isInit ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( !pPage->leaf ){
    int idx = pCur->ix;
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ) return rc;
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->ix==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
    }
    assert( pCur->info.nSize==0 );
    assert( (pCur->curFlags & (BTCF_ValidOvfl))==0 );

    pCur->ix--;
    pPage = pCur->pPage;
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, 0);
    }else{
      rc = SQLITE_OK;
    }
  }
  return rc;
}